

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O0

void funcinfo(lua_Debug *ar,Closure *cl)

{
  SharedProto *pSVar1;
  char *pcVar2;
  TString *local_28;
  SharedProto *p;
  Closure *cl_local;
  lua_Debug *ar_local;
  
  if ((cl == (Closure *)0x0) || ((cl->c).tt == '&')) {
    ar->source = "=[C]";
    ar->linedefined = -1;
    ar->lastlinedefined = -1;
    ar->what = "C";
  }
  else {
    pSVar1 = ((cl->l).p)->sp;
    if (pSVar1->source == (TString *)0x0) {
      local_28 = (TString *)0x16e8f3;
    }
    else {
      local_28 = pSVar1->source + 1;
    }
    ar->source = (char *)local_28;
    ar->linedefined = pSVar1->linedefined;
    ar->lastlinedefined = pSVar1->lastlinedefined;
    pcVar2 = "Lua";
    if (ar->linedefined == 0) {
      pcVar2 = "main";
    }
    ar->what = pcVar2;
  }
  luaO_chunkid(ar->short_src,ar->source,0x3c);
  return;
}

Assistant:

static void funcinfo (lua_Debug *ar, Closure *cl) {
  if (noLuaClosure(cl)) {
    ar->source = "=[C]";
    ar->linedefined = -1;
    ar->lastlinedefined = -1;
    ar->what = "C";
  }
  else {
    SharedProto *p = cl->l.p->sp;
    ar->source = p->source ? getstr(p->source) : "=?";
    ar->linedefined = p->linedefined;
    ar->lastlinedefined = p->lastlinedefined;
    ar->what = (ar->linedefined == 0) ? "main" : "Lua";
  }
  luaO_chunkid(ar->short_src, ar->source, LUA_IDSIZE);
}